

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledMisc.cpp
# Opt level: O0

Box2i Imf_2_5::dataWindowForTile
                (TileDescription *tileDesc,int minX,int maxX,int minY,int maxY,int dx,int dy,int lx,
                int ly)

{
  int a;
  Box<Imath_2_5::Vec2<int>_> *this;
  int *piVar1;
  int *__b;
  int in_EDX;
  Vec2<int> extraout_RDX;
  int *in_RSI;
  Vec2<int> in_RDI;
  int in_R8D;
  Box2i BVar2;
  int in_stack_00000008;
  int in_stack_00000010;
  undefined4 in_stack_00000020;
  V2i levelMax;
  V2i tileMax;
  V2i tileMin;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  Vec2<int> *in_stack_ffffffffffffff78;
  Vec2<int> VVar3;
  Vec2<int> in_stack_ffffffffffffffa8;
  Vec2<int> VStack_48;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc8;
  Vec2<int> local_30;
  Vec2<int> local_28 [3];
  int *local_10;
  
  VVar3 = in_RDI;
  local_10 = in_RSI;
  Imath_2_5::Vec2<int>::Vec2
            (local_28,in_EDX + in_stack_00000008 * *in_RSI,in_R8D + in_stack_00000010 * in_RSI[1]);
  Imath_2_5::Vec2<int>::Vec2((Vec2<int> *)&stack0xffffffffffffffc8,*local_10 + -1,local_10[1] + -1);
  Imath_2_5::Vec2<int>::operator+
            (in_stack_ffffffffffffff78,
             (Vec2<int> *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  dataWindowForLevel((TileDescription *)in_stack_ffffffffffffffa8,VVar3.y,VVar3.x,in_RDI.y,in_RDI.x,
                     in_stack_ffffffffffffffc0,in_stack_ffffffffffffffc8);
  Imath_2_5::Vec2<int>::Vec2((Vec2<int> *)&stack0xffffffffffffffc0,&VStack_48);
  this = (Box<Imath_2_5::Vec2<int>_> *)Imath_2_5::Vec2<int>::operator[](&local_30,0);
  piVar1 = Imath_2_5::Vec2<int>::operator[]((Vec2<int> *)&stack0xffffffffffffffc0,0);
  piVar1 = std::min<int>((int *)this,piVar1);
  a = *piVar1;
  piVar1 = Imath_2_5::Vec2<int>::operator[](&local_30,1);
  __b = Imath_2_5::Vec2<int>::operator[]((Vec2<int> *)&stack0xffffffffffffffc0,1);
  piVar1 = std::min<int>(piVar1,__b);
  Imath_2_5::Vec2<int>::Vec2((Vec2<int> *)&stack0xffffffffffffffa8,a,*piVar1);
  Imath_2_5::Vec2<int>::operator=(&local_30,(Vec2<int> *)&stack0xffffffffffffffa8);
  Imath_2_5::Box<Imath_2_5::Vec2<int>_>::Box
            (this,in_stack_ffffffffffffff78,
             (Vec2<int> *)CONCAT44(in_stack_ffffffffffffff74,in_stack_00000020));
  BVar2.max = extraout_RDX;
  BVar2.min = VVar3;
  return BVar2;
}

Assistant:

Box2i
dataWindowForTile (const TileDescription &tileDesc,
		   int minX, int maxX,
		   int minY, int maxY,
		   int dx, int dy,
		   int lx, int ly)
{
    V2i tileMin = V2i (minX + dx * tileDesc.xSize,
		       minY + dy * tileDesc.ySize);

    V2i tileMax = tileMin + V2i (tileDesc.xSize - 1, tileDesc.ySize - 1);

    V2i levelMax = dataWindowForLevel
		       (tileDesc, minX, maxX, minY, maxY, lx, ly).max;

    tileMax = V2i (std::min (tileMax[0], levelMax[0]),
		   std::min (tileMax[1], levelMax[1]));

    return Box2i (tileMin, tileMax);
}